

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngSTBStart(void *state,u16 *z)

{
  u16 uVar1;
  long in_RSI;
  prng_stb_st *in_RDI;
  size_t i;
  prng_stb_st *s;
  ulong local_20;
  
  for (local_20 = 0; local_20 < 0x1f; local_20 = local_20 + 1) {
    if (in_RSI == 0) {
      uVar1 = (short)local_20 + 1;
    }
    else {
      uVar1 = *(u16 *)(in_RSI + local_20 * 2);
    }
    in_RDI->z[local_20] = uVar1;
  }
  in_RDI->w = 0;
  in_RDI->v = 0;
  in_RDI->i = 0;
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    _prngSTBClock(in_RDI);
  }
  return;
}

Assistant:

void prngSTBStart(void* state, const u16 z[31])
{
	prng_stb_st* s = (prng_stb_st*)state;
	size_t i;
	// pre
	ASSERT(memIsValid(s, sizeof(prng_stb_st)));
	ASSERT(memIsNullOrValid(z, 2 * 31));
	// загрузить z
	for (i = 0; i < 31; ++i)
	{
		s->z[i] = z ? z[i] : (u16)(i + 1);
		ASSERT(s->z[i] > 0 && s->z[i] < 65257);
	}
	// настроить состояние
	s->v = s->w = 0;
	s->i = 0;
	// холостой ход
	for (i = 0; i < 256; ++i)
		_prngSTBClock(s);
}